

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerTestObject.h
# Opt level: O3

RecyclerTestObject * LeafObject<51U,_1000U>::New(void)

{
  code *pcVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  BOOL BVar5;
  Recycler *this;
  RecyclerTestObject *pRVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  type_info *ptVar10;
  undefined4 *in_FS_OFFSET;
  undefined1 auVar11 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar12 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar13 [16];
  undefined1 local_58 [8];
  TrackAllocData data;
  
  uVar4 = PAL_rand();
  ptVar10 = (type_info *)(ulong)((uVar4 % 0x3b6) * 8 + 0x198);
  local_58 = (undefined1  [8])&LeafObject<51u,1000u>::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_426b;
  data.filename._0_4_ = 0x91;
  data.typeinfo = ptVar10;
  this = Memory::Recycler::TrackAllocInfo(recyclerInstance,(TrackAllocData *)local_58);
  BVar5 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar3) goto LAB_001bad31;
    *in_FS_OFFSET = 0;
  }
  pRVar6 = (RecyclerTestObject *)
           Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                     (this,(size_t)(ptVar10 + 0x18));
  if (pRVar6 == (RecyclerTestObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar3) {
LAB_001bad31:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *in_FS_OFFSET = 0;
  }
  uVar7 = uVar4 % 0x3b6 + 0x33;
  pRVar6->generation = RecyclerTestObject::currentGeneration;
  (pRVar6->super_IRecyclerVisitedObject)._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_00357308;
  *(uint *)&pRVar6[1].super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = uVar7;
  auVar2 = _DAT_002d2040;
  lVar8 = (ulong)uVar7 - 1;
  auVar11._8_4_ = (int)lVar8;
  auVar11._0_8_ = lVar8;
  auVar11._12_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar12 = pmovsxbq(in_XMM1,0x100);
  uVar9 = 0;
  auVar11 = auVar11 ^ _DAT_002d2040;
  auVar13 = pmovsxbq(in_XMM4,0x202);
  do {
    if ((bool)(~(auVar11._0_8_ < SUB168(auVar12 ^ auVar2,0)) & 1)) {
      (&pRVar6[1].generation)[uVar9] = uVar9;
    }
    if (SUB168(auVar12 ^ auVar2,8) <= auVar11._8_8_) {
      (&pRVar6[2].super_IRecyclerVisitedObject)[uVar9]._vptr_IRecyclerVisitedObject =
           (_func_int **)(uVar9 + 1);
    }
    uVar9 = uVar9 + 2;
    lVar8 = auVar12._8_8_;
    auVar12._0_8_ = auVar12._0_8_ + auVar13._0_8_;
    auVar12._8_8_ = lVar8 + auVar13._8_8_;
  } while ((uVar4 % 0x3b6 + 0x34 & 0xffe) != uVar9);
  return pRVar6;
}

Assistant:

static RecyclerTestObject * New()
    {
        unsigned int count = minCount + GetRandomInteger(maxCount - minCount + 1);

        return RecyclerNewPlusLeaf(recyclerInstance, sizeof(size_t) * count, LeafObject, count);
    }